

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTexture.cpp
# Opt level: O2

void __thiscall
GmmLib::GmmTextureCalc::GetCompressionBlockDimensions
          (GmmTextureCalc *this,GMM_RESOURCE_FORMAT Format,uint32_t *pWidth,uint32_t *pHeight,
          uint32_t *pDepth)

{
  uint uVar1;
  
  if (pDepth != (uint32_t *)0x0 && (pHeight != (uint32_t *)0x0 && pWidth != (uint32_t *)0x0)) {
    if (Format - GMM_FORMAT_A1B5G5R5_UNORM < 0x180) {
      *pWidth = (uint)(this->pGmmLibContext->pPlatformInfo->Data).FormatTable[Format].Element.Width;
      *pHeight = (uint)(this->pGmmLibContext->pPlatformInfo->Data).FormatTable[Format].Element.
                       Height;
      uVar1 = (uint)(this->pGmmLibContext->pPlatformInfo->Data).FormatTable[Format].Element.Depth;
    }
    else {
      uVar1 = 1;
      *pWidth = 1;
      *pHeight = 1;
    }
    *pDepth = uVar1;
  }
  return;
}

Assistant:

void GmmLib::GmmTextureCalc::GetCompressionBlockDimensions(GMM_RESOURCE_FORMAT Format,
                                                           uint32_t *          pWidth,
                                                           uint32_t *          pHeight,
                                                           uint32_t *          pDepth)
{

    GMM_DPF_ENTER;
    __GMM_ASSERT(pWidth && pHeight && pDepth);

    if(pWidth && pHeight && pDepth)
    {
        if((Format > GMM_FORMAT_INVALID) && (Format < GMM_RESOURCE_FORMATS))
        {
            *pWidth  = pGmmLibContext->GetPlatformInfo().FormatTable[Format].Element.Width;
            *pHeight = pGmmLibContext->GetPlatformInfo().FormatTable[Format].Element.Height;
            *pDepth  = pGmmLibContext->GetPlatformInfo().FormatTable[Format].Element.Depth;
        }
        else
        {
            *pWidth  = 1;
            *pHeight = 1;
            *pDepth  = 1;
        }
    }
    GMM_DPF_EXIT;
}